

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DynamicTypeHandler::SetPropertyUpdateSideEffect
          (DynamicTypeHandler *this,DynamicObject *instance,CharacterBuffer<char16_t> *propertyName,
          Var value,SideEffects possibleSideEffects)

{
  ScriptContext *this_00;
  bool bVar1;
  int iVar2;
  Type TVar3;
  SideEffects se;
  char16_t *string2;
  undefined3 in_register_00000081;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  if (CONCAT31(in_register_00000081,possibleSideEffects) == 0) {
    return;
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  string2 = (propertyName->string).ptr;
  TVar3 = propertyName->len;
  if (TVar3 == 7) {
    if ((string2 == (char16_t *)(BuiltInPropertyRecords::valueOf + 0x18)) ||
       (iVar2 = PAL_wmemcmp((char16_t *)(BuiltInPropertyRecords::valueOf + 0x18),string2,7),
       iVar2 == 0)) {
      se = possibleSideEffects & SideEffects_ValueOf;
      goto LAB_00e4d358;
    }
    TVar3 = propertyName->len;
    string2 = (propertyName->string).ptr;
  }
  if (TVar3 == 8) {
    if ((string2 == (char16_t *)(BuiltInPropertyRecords::toString + 0x18)) ||
       (iVar2 = PAL_wmemcmp((char16_t *)(BuiltInPropertyRecords::toString + 0x18),string2,8),
       iVar2 == 0)) {
      se = possibleSideEffects & SideEffects_ToString;
      goto LAB_00e4d358;
    }
    string2 = (propertyName->string).ptr;
    TVar3 = propertyName->len;
  }
  if ((TVar3 == 4) &&
     ((string2 == (char16_t *)(BuiltInPropertyRecords::Math + 0x18) ||
      (iVar2 = PAL_wmemcmp((char16_t *)(BuiltInPropertyRecords::Math + 0x18),string2,4), iVar2 == 0)
      ))) {
    if ((((this_00->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
        globalObject.ptr == (GlobalObject *)instance) {
      se = possibleSideEffects & SideEffects_MathFunc;
LAB_00e4d358:
      ScriptContextOptimizationOverrideInfo::SetSideEffects(&this_00->optimizationOverrides,se);
      return;
    }
  }
  else if (((((this_00->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            mathObject.ptr == instance) &&
          ((ScriptContext::FindPropertyRecord
                      (this_00,(propertyName->string).ptr,propertyName->len,&local_30),
           local_30 != (PropertyRecord *)0x0 && (bVar1 = IsMathLibraryId(local_30->pid), bVar1)))) {
    ScriptContextOptimizationOverrideInfo::SetSideEffects
              (&this_00->optimizationOverrides,possibleSideEffects & SideEffects_MathFunc);
  }
  return;
}

Assistant:

void DynamicTypeHandler::SetPropertyUpdateSideEffect(DynamicObject* instance, JsUtil::CharacterBuffer<WCHAR> const& propertyName, Var value, SideEffects possibleSideEffects)
    {
        if (possibleSideEffects)
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            if (BuiltInPropertyRecords::valueOf.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_ValueOf & possibleSideEffects));
            }
            else if (BuiltInPropertyRecords::toString.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_ToString & possibleSideEffects));
            }
            else if (BuiltInPropertyRecords::Math.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                if (instance == scriptContext->GetLibrary()->GetGlobalObject())
                {
                    scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_MathFunc & possibleSideEffects));
                }
            }
            else if (instance == scriptContext->GetLibrary()->GetMathObject())
            {
                PropertyRecord const* propertyRecord;
                scriptContext->FindPropertyRecord(propertyName.GetBuffer(), propertyName.GetLength(), &propertyRecord);

                if (propertyRecord && IsMathLibraryId(propertyRecord->GetPropertyId()))
                {
                    scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_MathFunc & possibleSideEffects));
                }
            }

        }
    }